

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

_Bool getaddressinfo(sockaddr *sa,char *addr,long *port)

{
  uint16_t uVar1;
  char *pcVar2;
  sockaddr_un *su;
  sockaddr_in *si;
  unsigned_short us_port;
  long *port_local;
  char *addr_local;
  sockaddr *sa_local;
  
  if (sa->sa_family == 1) {
    curl_msnprintf(addr,0x2e,"%s",sa->sa_data);
    *port = 0;
    sa_local._7_1_ = true;
  }
  else if ((sa->sa_family == 2) &&
          (pcVar2 = Curl_inet_ntop((uint)sa->sa_family,sa->sa_data + 2,addr,0x2e),
          pcVar2 != (char *)0x0)) {
    uVar1 = ntohs(*(uint16_t *)sa->sa_data);
    *port = (ulong)uVar1;
    sa_local._7_1_ = true;
  }
  else {
    *addr = '\0';
    *port = 0;
    sa_local._7_1_ = false;
  }
  return sa_local._7_1_;
}

Assistant:

static bool getaddressinfo(struct sockaddr *sa, char *addr,
                           long *port)
{
  unsigned short us_port;
  struct sockaddr_in *si = NULL;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *si6 = NULL;
#endif
#if defined(HAVE_SYS_UN_H) && defined(AF_UNIX)
  struct sockaddr_un *su = NULL;
#endif

  switch(sa->sa_family) {
    case AF_INET:
      si = (struct sockaddr_in *)(void *) sa;
      if(Curl_inet_ntop(sa->sa_family, &si->sin_addr,
                        addr, MAX_IPADR_LEN)) {
        us_port = ntohs(si->sin_port);
        *port = us_port;
        return TRUE;
      }
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      si6 = (struct sockaddr_in6 *)(void *) sa;
      if(Curl_inet_ntop(sa->sa_family, &si6->sin6_addr,
                        addr, MAX_IPADR_LEN)) {
        us_port = ntohs(si6->sin6_port);
        *port = us_port;
        return TRUE;
      }
      break;
#endif
#if defined(HAVE_SYS_UN_H) && defined(AF_UNIX)
    case AF_UNIX:
      su = (struct sockaddr_un*)sa;
      snprintf(addr, MAX_IPADR_LEN, "%s", su->sun_path);
      *port = 0;
      return TRUE;
#endif
    default:
      break;
  }

  addr[0] = '\0';
  *port = 0;

  return FALSE;
}